

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_data.cc
# Opt level: O2

void __thiscall vw_ostream::vw_streambuf::sync(vw_streambuf *this)

{
  undefined8 uVar1;
  code *pcVar2;
  allocator local_41;
  string local_40 [32];
  
  uVar1 = *(undefined8 *)&(this->parent->super_ostream).field_0x78;
  pcVar2 = *(code **)&(this->parent->super_ostream).field_0x80;
  std::__cxx11::stringbuf::str();
  (*pcVar2)(uVar1,local_40);
  std::__cxx11::string::~string(local_40);
  std::__cxx11::string::string(local_40,"",&local_41);
  std::__cxx11::stringbuf::str((string *)this);
  std::__cxx11::string::~string(local_40);
  return;
}

Assistant:

int vw_ostream::vw_streambuf::sync()
{
  int ret = std::stringbuf::sync();
  if (ret)
    return ret;

  parent.trace_listener(parent.trace_context, str());
  str("");
  return 0;  // success
}